

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestTest.cpp
# Opt level: O0

void __thiscall
TEST_UtestShell_StandardExceptionIsRethrownIfEnabled_TestShell::
~TEST_UtestShell_StandardExceptionIsRethrownIfEnabled_TestShell
          (TEST_UtestShell_StandardExceptionIsRethrownIfEnabled_TestShell *this)

{
  TEST_UtestShell_StandardExceptionIsRethrownIfEnabled_TestShell *this_local;
  
  ~TEST_UtestShell_StandardExceptionIsRethrownIfEnabled_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(UtestShell, StandardExceptionIsRethrownIfEnabled)
{
    bool initialRethrowExceptions = UtestShell::isRethrowingExceptions();
    bool exceptionRethrown = false;
    stopAfterFailure = 0;
    UtestShell::setRethrowExceptions(true);
    shouldThrowException = true;
    fixture.setTestFunction(thrownStandardExceptionMethod_);
    try
    {
        fixture.runAllTests();
        stopAfterFailure++;
    }
    catch(const std::exception &)
    {
        exceptionRethrown = true;
    }
    CHECK_TRUE(exceptionRethrown);
    LONGS_EQUAL(1, fixture.getFailureCount());
    fixture.assertPrintContains("Unexpected exception of type '");
    fixture.assertPrintContains("runtime_error");
    fixture.assertPrintContains("' was thrown: exception text");
    LONGS_EQUAL(0, stopAfterFailure);
    UtestShell::setRethrowExceptions(initialRethrowExceptions);
}